

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O1

shared_ptr<TestSharedPtrObj> * __thiscall
rcc::shared_ptr<TestSharedPtrObj>::operator=
          (shared_ptr<TestSharedPtrObj> *this,shared_ptr<TestSharedPtrObj> *other)

{
  IObjectSharedState *this_00;
  IObject *pIVar1;
  TestSharedPtrObj *pTVar2;
  
  if (this->obj_state != (IObjectSharedState *)0x0) {
    IObjectSharedState::DecrementObject(this->obj_state);
    IObjectSharedState::DecrementState(this->obj_state);
  }
  this_00 = other->obj_state;
  this->obj_state = this_00;
  if (this_00 != (IObjectSharedState *)0x0) {
    pIVar1 = IObjectSharedState::GetIObject(this_00);
    if (pIVar1 == (IObject *)0x0) {
      pTVar2 = (TestSharedPtrObj *)0x0;
    }
    else {
      pTVar2 = (TestSharedPtrObj *)
               __dynamic_cast(pIVar1,&IObject::typeinfo,&TestSharedPtrObj::typeinfo,0);
    }
    this->obj_pointer = pTVar2;
    if (pTVar2 == (TestSharedPtrObj *)0x0) {
      this->obj_state = (IObjectSharedState *)0x0;
    }
    else {
      other->obj_state = (IObjectSharedState *)0x0;
      other->obj_pointer = (TestSharedPtrObj *)0x0;
    }
  }
  return this;
}

Assistant:

shared_ptr& operator=(shared_ptr<T>&& other){
            if(obj_state){
                obj_state->DecrementObject();
                obj_state->DecrementState();
            }
            obj_state = other.obj_state;
            if(obj_state){
                if((obj_pointer = dynamic_cast<T*>(this->obj_state->GetIObject()))){
                    other.obj_state = nullptr;
                    other.obj_pointer = nullptr;
                }else{
                    obj_state = nullptr;
                }
            }
            return *this;
        }